

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O1

QRegion __thiscall QRegion::intersected(QRegion *this,QRegion *r)

{
  int iVar1;
  int iVar2;
  QRegionPrivate *pQVar3;
  long lVar4;
  QRegionData *pQVar5;
  QRegion *in_RDX;
  QRegionPrivate *pQVar6;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = r->d->qt_rgn;
  if ((pQVar6 != (QRegionPrivate *)0x0) && (pQVar6->numRects != 0)) {
    pQVar3 = in_RDX->d->qt_rgn;
    if (((pQVar3 != (QRegionPrivate *)0x0) &&
        (((pQVar3->numRects != 0 &&
          (iVar1 = (pQVar3->extents).x1.m_i, iVar1 <= (pQVar6->extents).x2.m_i)) &&
         (iVar2 = (pQVar6->extents).x1.m_i, iVar2 <= (pQVar3->extents).x2.m_i)))) &&
       (((pQVar3->extents).y1.m_i <= (pQVar6->extents).y2.m_i &&
        ((pQVar6->extents).y1.m_i <= (pQVar3->extents).y2.m_i)))) {
      if ((iVar2 < (pQVar3->innerRect).x1.m_i) ||
         ((((pQVar3->innerRect).x2.m_i < (pQVar6->extents).x2.m_i ||
           ((pQVar6->extents).y1.m_i < (pQVar3->innerRect).y1.m_i)) ||
          ((pQVar3->innerRect).y2.m_i < (pQVar6->extents).y2.m_i)))) {
        if ((((iVar1 < (pQVar6->innerRect).x1.m_i) ||
             ((pQVar6->innerRect).x2.m_i < (pQVar3->extents).x2.m_i)) ||
            ((pQVar3->extents).y1.m_i < (pQVar6->innerRect).y1.m_i)) ||
           ((pQVar6->innerRect).y2.m_i < (pQVar3->extents).y2.m_i)) {
          if (pQVar3->numRects == 1) {
            if (pQVar6->numRects == 1) {
              local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_38._0_16_ =
                   (undefined1  [16])
                   qt_rect_intersect_normalized(&in_RDX->d->qt_rgn->extents,&r->d->qt_rgn->extents);
              QRegion(this,(QRect *)local_38,Rectangle);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
                return (QRegion)(QRegionData *)this;
              }
              goto LAB_004308e1;
            }
            this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            QRegion(this,r);
            detach(this);
            pQVar6 = this->d->qt_rgn;
            pQVar5 = in_RDX->d;
          }
          else {
            iVar1 = pQVar6->numRects;
            this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            if (iVar1 != 1) {
              QRegion(this);
              detach(this);
              miRegionOp(this->d->qt_rgn,r->d->qt_rgn,in_RDX->d->qt_rgn,miIntersectO,
                         (NonOverlapFunc)0x0,(NonOverlapFunc)0x0);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
                miSetExtents(this->d->qt_rgn);
                return (QRegion)(QRegionData *)this;
              }
              goto LAB_004308e1;
            }
            QRegion(this,in_RDX);
            detach(this);
            pQVar6 = this->d->qt_rgn;
            pQVar5 = r->d;
          }
          if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
            QRegionPrivate::intersect(pQVar6,&pQVar5->qt_rgn->extents);
            return (QRegion)(QRegionData *)this;
          }
          goto LAB_004308e1;
        }
        lVar4 = *(long *)(in_FS_OFFSET + 0x28);
        r = in_RDX;
      }
      else {
        lVar4 = *(long *)(in_FS_OFFSET + 0x28);
      }
      if (lVar4 == local_20) {
        QRegion(this,r);
        return (QRegion)(QRegionData *)this;
      }
      goto LAB_004308e1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QRegion(this);
    return (QRegion)(QRegionData *)this;
  }
LAB_004308e1:
  __stack_chk_fail();
}

Assistant:

QRegion QRegion::intersected(const QRegion &r) const
{
    if (isEmptyHelper(d->qt_rgn) || isEmptyHelper(r.d->qt_rgn)
        || !EXTENTCHECK(&d->qt_rgn->extents, &r.d->qt_rgn->extents))
        return QRegion();

    /* this is fully contained in r */
    if (r.d->qt_rgn->contains(*d->qt_rgn))
        return *this;

    /* r is fully contained in this */
    if (d->qt_rgn->contains(*r.d->qt_rgn))
        return r;

    if (r.d->qt_rgn->numRects == 1 && d->qt_rgn->numRects == 1) {
        const QRect rect = qt_rect_intersect_normalized(r.d->qt_rgn->extents,
                                                        d->qt_rgn->extents);
        return QRegion(rect);
    } else if (r.d->qt_rgn->numRects == 1) {
        QRegion result(*this);
        result.detach();
        result.d->qt_rgn->intersect(r.d->qt_rgn->extents);
        return result;
    } else if (d->qt_rgn->numRects == 1) {
        QRegion result(r);
        result.detach();
        result.d->qt_rgn->intersect(d->qt_rgn->extents);
        return result;
    }

    QRegion result;
    result.detach();
    miRegionOp(*result.d->qt_rgn, d->qt_rgn, r.d->qt_rgn, miIntersectO, nullptr, nullptr);

    /*
     * Can't alter dest's extents before we call miRegionOp because
     * it might be one of the source regions and miRegionOp depends
     * on the extents of those regions being the same. Besides, this
     * way there's no checking against rectangles that will be nuked
     * due to coalescing, so we have to examine fewer rectangles.
     */
    miSetExtents(*result.d->qt_rgn);
    return result;
}